

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::to_flattened_access_chain_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  uint32_t uVar1;
  string local_80;
  SPIRExpression *local_60;
  SPIRExpression *expr;
  SPIRVariable *local_28;
  SPIRVariable *var;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  string *basename;
  
  var._3_1_ = 0;
  var._4_4_ = id;
  pCStack_18 = this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = Compiler::maybe_get<diligent_spirv_cross::SPIRVariable>
                       (&this->super_Compiler,var._4_4_);
  if (local_28 == (SPIRVariable *)0x0) {
    local_60 = Compiler::maybe_get<diligent_spirv_cross::SPIRExpression>
                         (&this->super_Compiler,var._4_4_);
    if (local_60 == (SPIRExpression *)0x0) {
      to_expression_abi_cxx11_(&local_80,this,var._4_4_,true);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_80);
    }
    else {
      ::std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)&local_60->expression);
    }
  }
  else {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_28->super_IVariant).self);
    (*(this->super_Compiler)._vptr_Compiler[6])(&expr,this,(ulong)uVar1,1);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&expr);
    ::std::__cxx11::string::~string((string *)&expr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::to_flattened_access_chain_expression(uint32_t id)
{
	// Do not use to_expression as that will unflatten access chains.
	string basename;
	if (const auto *var = maybe_get<SPIRVariable>(id))
		basename = to_name(var->self);
	else if (const auto *expr = maybe_get<SPIRExpression>(id))
		basename = expr->expression;
	else
		basename = to_expression(id);

	return basename;
}